

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O1

int __thiscall
deqp::egl::SwapBuffersWithDamageTests::init(SwapBuffersWithDamageTests *this,EVP_PKEY_CTX *ctx)

{
  int iterationTimes;
  EglTestContext *eglTestCtx;
  int extraout_EAX;
  _Alloc_hider _Var1;
  SwapBuffersWithDamageTest *pSVar2;
  long *plVar3;
  allocator_type *__a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_00;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_01;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_02;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_03;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_04;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_05;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_06;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType;
  char *in_R9;
  _anonymous_namespace_ *p_Var6;
  _anonymous_namespace_ *this_00;
  long lVar7;
  string name;
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  frameDrawTypes;
  DrawType renderClear [2];
  DrawType clearRender [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  TestCaseGroup *local_98;
  TestNode *local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  local_68;
  _anonymous_namespace_ *local_50;
  DrawType local_48 [4];
  long local_38;
  
  local_48[2] = DRAWTYPE_GLES2_CLEAR;
  local_48[3] = DRAWTYPE_GLES2_RENDER;
  local_48[0] = DRAWTYPE_GLES2_RENDER;
  local_48[1] = DRAWTYPE_GLES2_CLEAR;
  local_68.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_allocated_capacity = 0;
  local_90 = (TestNode *)this;
  _Var1._M_p = (pointer)operator_new(4);
  local_a8._M_allocated_capacity = (long)_Var1._M_p + 4;
  *(DrawType *)_Var1._M_p = DRAWTYPE_GLES2_CLEAR;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&stack0xffffffffffffff48);
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,local_a8._M_allocated_capacity - (long)_Var1._M_p);
  }
  local_a8._M_allocated_capacity = 0;
  _Var1._M_p = (pointer)operator_new(4);
  local_a8._M_allocated_capacity = (long)_Var1._M_p + 4;
  *(DrawType *)_Var1._M_p = DRAWTYPE_GLES2_RENDER;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&stack0xffffffffffffff48);
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,local_a8._M_allocated_capacity - (long)_Var1._M_p);
  }
  local_a8._M_allocated_capacity = 0;
  _Var1._M_p = (pointer)operator_new(8);
  local_a8._M_allocated_capacity = (long)_Var1._M_p + 8;
  *(DrawType *)((long)_Var1._M_p + 0) = DRAWTYPE_GLES2_CLEAR;
  *(DrawType *)((long)_Var1._M_p + 4) = DRAWTYPE_GLES2_CLEAR;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&stack0xffffffffffffff48);
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,local_a8._M_allocated_capacity - (long)_Var1._M_p);
  }
  local_a8._M_allocated_capacity = 0;
  _Var1._M_p = (pointer)operator_new(8);
  __a = (allocator_type *)((long)_Var1._M_p + 8);
  lVar5 = 0;
  do {
    *(undefined4 *)((long)_Var1._M_p + lVar5) = 1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 8);
  local_a8._M_allocated_capacity = (size_type)__a;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&stack0xffffffffffffff48);
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,local_a8._M_allocated_capacity - (long)_Var1._M_p);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&stack0xffffffffffffff48,local_48 + 2,(DrawType *)&local_38,__a);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&stack0xffffffffffffff48);
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,local_a8._M_allocated_capacity - (long)_Var1._M_p);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&stack0xffffffffffffff48,local_48,local_48 + 2,__a);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&local_68,(value_type *)&stack0xffffffffffffff48);
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,local_a8._M_allocated_capacity - (long)_Var1._M_p);
  }
  lVar5 = 0;
  do {
    iterationTimes = (&DAT_01be15a8)[lVar5];
    local_38 = lVar5;
    local_98 = (TestCaseGroup *)operator_new(0x78);
    eglTestCtx = (EglTestContext *)local_90[1]._vptr_TestNode;
    _Var1._M_p = (pointer)&local_a8;
    if (iterationTimes == 2) {
      local_88._0_8_ = (allocator_type *)0x11;
      _Var1._M_p = (pointer)std::__cxx11::string::_M_create
                                      ((ulong *)&stack0xffffffffffffff48,(ulong)local_88);
      *(undefined8 *)_Var1._M_p = 0x615f657a69736572;
      builtin_strncpy((char *)((long)_Var1._M_p + 8),"fter_swa",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)_Var1._M_p + 0x10))->_M_local_buf[0] = 'p';
LAB_00e4ce24:
      _Var1._M_p[local_88._0_8_] = '\0';
      local_a8._M_allocated_capacity = local_88._0_8_;
    }
    else {
      if (iterationTimes == 1) {
        local_88._0_8_ = (allocator_type *)0x12;
        _Var1._M_p = (pointer)std::__cxx11::string::_M_create
                                        ((ulong *)&stack0xffffffffffffff48,(ulong)local_88);
        *(undefined8 *)_Var1._M_p = 0x625f657a69736572;
        builtin_strncpy((char *)((long)_Var1._M_p + 8),"efore_sw",8);
        *(undefined2 *)((long)_Var1._M_p + 0x10) = 0x7061;
        goto LAB_00e4ce24;
      }
      if (iterationTimes == 0) {
        local_a8._M_allocated_capacity = 0x7a697365725f6f6e;
        local_a8._8_2_ = 0x65;
      }
      else {
        local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
      }
    }
    TestCaseGroup::TestCaseGroup
              (local_98,eglTestCtx,_Var1._M_p,glcts::fixed_sample_locations_values + 1);
    frameDrawType = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_a8) {
      operator_delete(_Var1._M_p,(ulong)(local_a8._M_allocated_capacity + 1));
      frameDrawType = extraout_RDX_00;
    }
    this_00 = (_anonymous_namespace_ *)
              local_68.
              super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = ((long)local_68.
                   super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_50 = (_anonymous_namespace_ *)
               local_68.
               super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_68.
        super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar7 = lVar5 + (ulong)(lVar5 == 0);
      p_Var6 = (_anonymous_namespace_ *)
               local_68.
               super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                  ((string *)&stack0xffffffffffffff48,p_Var6,frameDrawType);
        pSVar2 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
        egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                  (pSVar2,(EglTestContext *)local_90[1]._vptr_TestNode,
                   (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                    *)p_Var6,iterationTimes,(ResizeType)_Var1._M_p,in_R9,_Var1._M_p);
        tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pSVar2);
        frameDrawType = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_a8) {
          operator_delete(_Var1._M_p,(ulong)(local_a8._M_allocated_capacity + 1));
          frameDrawType = extraout_RDX_02;
        }
        p_Var6 = p_Var6 + 0x18;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    if (local_50 != this_00) {
      lVar7 = lVar5 + (ulong)(lVar5 == 0);
      p_Var6 = this_00;
      do {
        egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                  ((string *)local_88,p_Var6,frameDrawType);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x1be1204);
        _Var1._M_p = (pointer)&local_a8;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 == paVar4) {
          local_a8._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_a8._8_8_ = plVar3[3];
        }
        else {
          local_a8._M_allocated_capacity = paVar4->_M_allocated_capacity;
          _Var1._M_p = (pointer)*plVar3;
        }
        *plVar3 = (long)paVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((allocator_type *)local_88._0_8_ != (allocator_type *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
        }
        pSVar2 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
        egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                  (pSVar2,(EglTestContext *)local_90[1]._vptr_TestNode,
                   (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                    *)p_Var6,iterationTimes,(ResizeType)_Var1._M_p,in_R9,_Var1._M_p);
        (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SwapBuffersWithDamageTest_02161a20;
        tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pSVar2);
        frameDrawType = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_a8) {
          operator_delete(_Var1._M_p,(ulong)(local_a8._M_allocated_capacity + 1));
          frameDrawType = extraout_RDX_04;
        }
        p_Var6 = p_Var6 + 0x18;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    if (local_50 != this_00) {
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      do {
        egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                  ((string *)local_88,this_00,frameDrawType);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x1be1215);
        _Var1._M_p = (pointer)&local_a8;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 == paVar4) {
          local_a8._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_a8._8_8_ = plVar3[3];
        }
        else {
          local_a8._M_allocated_capacity = paVar4->_M_allocated_capacity;
          _Var1._M_p = (pointer)*plVar3;
        }
        *plVar3 = (long)paVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((allocator_type *)local_88._0_8_ != (allocator_type *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
        }
        pSVar2 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
        egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                  (pSVar2,(EglTestContext *)local_90[1]._vptr_TestNode,
                   (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                    *)this_00,iterationTimes,(ResizeType)_Var1._M_p,in_R9,_Var1._M_p);
        (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SwapBuffersWithDamageTest_02161a80;
        tcu::TestNode::addChild((TestNode *)local_98,(TestNode *)pSVar2);
        frameDrawType = extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_a8) {
          operator_delete(_Var1._M_p,(ulong)(local_a8._M_allocated_capacity + 1));
          frameDrawType = extraout_RDX_06;
        }
        this_00 = this_00 + 0x18;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    tcu::TestNode::addChild(local_90,(TestNode *)local_98);
    lVar5 = local_38 + 1;
    if (lVar5 == 3) {
      std::
      vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
      ::~vector(&local_68);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void SwapBuffersWithDamageTests::init (void)
{
	const DrawType clearRender[2] =
	{
		DRAWTYPE_GLES2_CLEAR,
		DRAWTYPE_GLES2_RENDER
	};

	const DrawType renderClear[2] =
	{
		DRAWTYPE_GLES2_RENDER,
		DRAWTYPE_GLES2_CLEAR
	};

	const ResizeType resizeTypes[] =
	{
		RESIZETYPE_NONE,
		RESIZETYPE_BEFORE_SWAP,
		RESIZETYPE_AFTER_SWAP
	};

	vector< vector<DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
	{
		const ResizeType		resizeType	= resizeTypes[resizeTypeNdx];
		TestCaseGroup* const	resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "preserve_buffer_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndPreserveBufferTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "buffer_age_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndBufferAgeTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(),  ""));
		}

		addChild(resizeGroup);
	}
}